

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O2

DataType glu::getDataTypeFromGLType(deUint32 glType)

{
  DataType DVar1;
  
  switch(glType) {
  case 0x8b50:
    DVar1 = TYPE_FLOAT_VEC2;
    break;
  case 0x8b51:
    DVar1 = TYPE_FLOAT_VEC3;
    break;
  case 0x8b52:
    DVar1 = TYPE_FLOAT_VEC4;
    break;
  case 0x8b53:
    DVar1 = TYPE_INT_VEC2;
    break;
  case 0x8b54:
    DVar1 = TYPE_INT_VEC3;
    break;
  case 0x8b55:
    DVar1 = TYPE_INT_VEC4;
    break;
  case 0x8b56:
    DVar1 = TYPE_BOOL;
    break;
  case 0x8b57:
    DVar1 = TYPE_BOOL_VEC2;
    break;
  case 0x8b58:
    DVar1 = TYPE_BOOL_VEC3;
    break;
  case 0x8b59:
    DVar1 = TYPE_BOOL_VEC4;
    break;
  case 0x8b5a:
    DVar1 = TYPE_FLOAT_MAT2;
    break;
  case 0x8b5b:
    DVar1 = TYPE_FLOAT_MAT3;
    break;
  case 0x8b5c:
    DVar1 = TYPE_FLOAT_MAT4;
    break;
  case 0x8b5d:
    DVar1 = TYPE_SAMPLER_1D;
    break;
  case 0x8b5e:
    DVar1 = TYPE_SAMPLER_2D;
    break;
  case 0x8b5f:
    DVar1 = TYPE_SAMPLER_3D;
    break;
  case 0x8b60:
    DVar1 = TYPE_SAMPLER_CUBE;
    break;
  case 0x8b61:
    DVar1 = TYPE_SAMPLER_1D_SHADOW;
    break;
  case 0x8b62:
    DVar1 = TYPE_SAMPLER_2D_SHADOW;
    break;
  case 0x8b63:
  case 0x8b64:
switchD_007065de_caseD_1407:
    DVar1 = TYPE_LAST;
    break;
  case 0x8b65:
    DVar1 = TYPE_FLOAT_MAT2X3;
    break;
  case 0x8b66:
    DVar1 = TYPE_FLOAT_MAT2X4;
    break;
  case 0x8b67:
    DVar1 = TYPE_FLOAT_MAT3X2;
    break;
  case 0x8b68:
    DVar1 = TYPE_FLOAT_MAT3X4;
    break;
  case 0x8b69:
    DVar1 = TYPE_FLOAT_MAT4X2;
    break;
  case 0x8b6a:
    DVar1 = TYPE_FLOAT_MAT4X3;
    break;
  default:
    switch(glType) {
    case 0x8dc0:
      DVar1 = TYPE_SAMPLER_1D_ARRAY;
      break;
    case 0x8dc1:
      DVar1 = TYPE_SAMPLER_2D_ARRAY;
      break;
    case 0x8dc2:
      DVar1 = TYPE_SAMPLER_BUFFER;
      break;
    case 0x8dc3:
      DVar1 = TYPE_SAMPLER_1D_ARRAY_SHADOW;
      break;
    case 0x8dc4:
      DVar1 = TYPE_SAMPLER_2D_ARRAY_SHADOW;
      break;
    case 0x8dc5:
      DVar1 = TYPE_SAMPLER_CUBE_SHADOW;
      break;
    case 0x8dc6:
      DVar1 = TYPE_UINT_VEC2;
      break;
    case 0x8dc7:
      DVar1 = TYPE_UINT_VEC3;
      break;
    case 0x8dc8:
      DVar1 = TYPE_UINT_VEC4;
      break;
    case 0x8dc9:
      DVar1 = TYPE_INT_SAMPLER_1D;
      break;
    case 0x8dca:
      DVar1 = TYPE_INT_SAMPLER_2D;
      break;
    case 0x8dcb:
      DVar1 = TYPE_INT_SAMPLER_3D;
      break;
    case 0x8dcc:
      DVar1 = TYPE_INT_SAMPLER_CUBE;
      break;
    case 0x8dcd:
    case 0x8dd5:
      goto switchD_007065de_caseD_1407;
    case 0x8dce:
      DVar1 = TYPE_INT_SAMPLER_1D_ARRAY;
      break;
    case 0x8dcf:
      DVar1 = TYPE_INT_SAMPLER_2D_ARRAY;
      break;
    case 0x8dd0:
      DVar1 = TYPE_INT_SAMPLER_BUFFER;
      break;
    case 0x8dd1:
      DVar1 = TYPE_UINT_SAMPLER_1D;
      break;
    case 0x8dd2:
      DVar1 = TYPE_UINT_SAMPLER_2D;
      break;
    case 0x8dd3:
      DVar1 = TYPE_UINT_SAMPLER_3D;
      break;
    case 0x8dd4:
      DVar1 = TYPE_UINT_SAMPLER_CUBE;
      break;
    case 0x8dd6:
      DVar1 = TYPE_UINT_SAMPLER_1D_ARRAY;
      break;
    case 0x8dd7:
      DVar1 = TYPE_UINT_SAMPLER_2D_ARRAY;
      break;
    case 0x8dd8:
      DVar1 = TYPE_UINT_SAMPLER_BUFFER;
      break;
    default:
      switch(glType) {
      case 0x904d:
        DVar1 = TYPE_IMAGE_2D;
        break;
      case 0x904e:
        DVar1 = TYPE_IMAGE_3D;
        break;
      case 0x904f:
      case 0x9052:
      case 0x9054:
      case 0x9055:
      case 0x9056:
      case 0x9057:
      case 0x905a:
      case 0x905d:
      case 0x905f:
      case 0x9060:
      case 0x9061:
      case 0x9062:
      case 0x9065:
      case 0x9068:
        goto switchD_007065de_caseD_1407;
      case 0x9050:
        DVar1 = TYPE_IMAGE_CUBE;
        break;
      case 0x9051:
        DVar1 = TYPE_IMAGE_BUFFER;
        break;
      case 0x9053:
        DVar1 = TYPE_IMAGE_2D_ARRAY;
        break;
      case 0x9058:
        DVar1 = TYPE_INT_IMAGE_2D;
        break;
      case 0x9059:
        DVar1 = TYPE_INT_IMAGE_3D;
        break;
      case 0x905b:
        DVar1 = TYPE_INT_IMAGE_CUBE;
        break;
      case 0x905c:
        DVar1 = TYPE_INT_IMAGE_BUFFER;
        break;
      case 0x905e:
        DVar1 = TYPE_INT_IMAGE_2D_ARRAY;
        break;
      case 0x9063:
        DVar1 = TYPE_UINT_IMAGE_2D;
        break;
      case 0x9064:
        DVar1 = TYPE_UINT_IMAGE_3D;
        break;
      case 0x9066:
        DVar1 = TYPE_UINT_IMAGE_CUBE;
        break;
      case 0x9067:
        DVar1 = TYPE_UINT_IMAGE_BUFFER;
        break;
      case 0x9069:
        DVar1 = TYPE_UINT_IMAGE_2D_ARRAY;
        break;
      default:
        switch(glType) {
        case 0x8f46:
          DVar1 = TYPE_DOUBLE_MAT2;
          break;
        case 0x8f47:
          DVar1 = TYPE_DOUBLE_MAT3;
          break;
        case 0x8f48:
          DVar1 = TYPE_DOUBLE_MAT4;
          break;
        case 0x8f49:
          DVar1 = TYPE_DOUBLE_MAT2X3;
          break;
        case 0x8f4a:
          DVar1 = TYPE_DOUBLE_MAT2X4;
          break;
        case 0x8f4b:
          DVar1 = TYPE_DOUBLE_MAT3X2;
          break;
        case 0x8f4c:
          DVar1 = TYPE_DOUBLE_MAT3X4;
          break;
        case 0x8f4d:
          DVar1 = TYPE_DOUBLE_MAT4X2;
          break;
        case 0x8f4e:
          DVar1 = TYPE_DOUBLE_MAT4X3;
          break;
        default:
          switch(glType) {
          case 0x9108:
            DVar1 = TYPE_SAMPLER_2D_MULTISAMPLE;
            break;
          case 0x9109:
            DVar1 = TYPE_INT_SAMPLER_2D_MULTISAMPLE;
            break;
          case 0x910a:
            DVar1 = TYPE_UINT_SAMPLER_2D_MULTISAMPLE;
            break;
          case 0x910b:
            DVar1 = TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY;
            break;
          case 0x910c:
            DVar1 = TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY;
            break;
          case 0x910d:
            DVar1 = TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY;
            break;
          default:
            switch(glType) {
            case 0x1404:
              DVar1 = TYPE_INT;
              break;
            case 0x1405:
              DVar1 = TYPE_UINT;
              break;
            case 0x1406:
              DVar1 = TYPE_FLOAT;
              break;
            case 0x1407:
            case 0x1408:
            case 0x1409:
              goto switchD_007065de_caseD_1407;
            case 0x140a:
              DVar1 = TYPE_DOUBLE;
              break;
            default:
              switch(glType) {
              case 0x900c:
                DVar1 = TYPE_SAMPLER_CUBE_ARRAY;
                break;
              case 0x900d:
                DVar1 = TYPE_SAMPLER_CUBE_ARRAY_SHADOW;
                break;
              case 0x900e:
                DVar1 = TYPE_INT_SAMPLER_CUBE_ARRAY;
                break;
              case 0x900f:
                DVar1 = TYPE_UINT_SAMPLER_CUBE_ARRAY;
                break;
              default:
                if (glType == 0x8ffc) {
                  return TYPE_DOUBLE_VEC2;
                }
                if (glType == 0x8ffd) {
                  return TYPE_DOUBLE_VEC3;
                }
                if (glType == 0x8ffe) {
                  return TYPE_DOUBLE_VEC4;
                }
                if (glType == 0x92db) {
                  return TYPE_UINT_ATOMIC_COUNTER;
                }
                goto switchD_007065de_caseD_1407;
              }
            }
          }
        }
      }
    }
  }
  return DVar1;
}

Assistant:

DataType getDataTypeFromGLType (deUint32 glType)
{
	switch (glType)
	{
		case GL_FLOAT:										return TYPE_FLOAT;
		case GL_FLOAT_VEC2:									return TYPE_FLOAT_VEC2;
		case GL_FLOAT_VEC3:									return TYPE_FLOAT_VEC3;
		case GL_FLOAT_VEC4:									return TYPE_FLOAT_VEC4;

		case GL_FLOAT_MAT2:									return TYPE_FLOAT_MAT2;
		case GL_FLOAT_MAT2x3:								return TYPE_FLOAT_MAT2X3;
		case GL_FLOAT_MAT2x4:								return TYPE_FLOAT_MAT2X4;

		case GL_FLOAT_MAT3x2:								return TYPE_FLOAT_MAT3X2;
		case GL_FLOAT_MAT3:									return TYPE_FLOAT_MAT3;
		case GL_FLOAT_MAT3x4:								return TYPE_FLOAT_MAT3X4;

		case GL_FLOAT_MAT4x2:								return TYPE_FLOAT_MAT4X2;
		case GL_FLOAT_MAT4x3:								return TYPE_FLOAT_MAT4X3;
		case GL_FLOAT_MAT4:									return TYPE_FLOAT_MAT4;

		case GL_DOUBLE:										return TYPE_DOUBLE;
		case GL_DOUBLE_VEC2:								return TYPE_DOUBLE_VEC2;
		case GL_DOUBLE_VEC3:								return TYPE_DOUBLE_VEC3;
		case GL_DOUBLE_VEC4:								return TYPE_DOUBLE_VEC4;

		case GL_DOUBLE_MAT2:								return TYPE_DOUBLE_MAT2;
		case GL_DOUBLE_MAT2x3:								return TYPE_DOUBLE_MAT2X3;
		case GL_DOUBLE_MAT2x4:								return TYPE_DOUBLE_MAT2X4;

		case GL_DOUBLE_MAT3x2:								return TYPE_DOUBLE_MAT3X2;
		case GL_DOUBLE_MAT3:								return TYPE_DOUBLE_MAT3;
		case GL_DOUBLE_MAT3x4:								return TYPE_DOUBLE_MAT3X4;

		case GL_DOUBLE_MAT4x2:								return TYPE_DOUBLE_MAT4X2;
		case GL_DOUBLE_MAT4x3:								return TYPE_DOUBLE_MAT4X3;
		case GL_DOUBLE_MAT4:								return TYPE_DOUBLE_MAT4;

		case GL_INT:										return TYPE_INT;
		case GL_INT_VEC2:									return TYPE_INT_VEC2;
		case GL_INT_VEC3:									return TYPE_INT_VEC3;
		case GL_INT_VEC4:									return TYPE_INT_VEC4;

		case GL_UNSIGNED_INT:								return TYPE_UINT;
		case GL_UNSIGNED_INT_VEC2:							return TYPE_UINT_VEC2;
		case GL_UNSIGNED_INT_VEC3:							return TYPE_UINT_VEC3;
		case GL_UNSIGNED_INT_VEC4:							return TYPE_UINT_VEC4;

		case GL_BOOL:										return TYPE_BOOL;
		case GL_BOOL_VEC2:									return TYPE_BOOL_VEC2;
		case GL_BOOL_VEC3:									return TYPE_BOOL_VEC3;
		case GL_BOOL_VEC4:									return TYPE_BOOL_VEC4;

		case GL_SAMPLER_1D:									return TYPE_SAMPLER_1D;
		case GL_SAMPLER_2D:									return TYPE_SAMPLER_2D;
		case GL_SAMPLER_CUBE:								return TYPE_SAMPLER_CUBE;
		case GL_SAMPLER_1D_ARRAY:							return TYPE_SAMPLER_1D_ARRAY;
		case GL_SAMPLER_2D_ARRAY:							return TYPE_SAMPLER_2D_ARRAY;
		case GL_SAMPLER_3D:									return TYPE_SAMPLER_3D;
		case GL_SAMPLER_CUBE_MAP_ARRAY:						return TYPE_SAMPLER_CUBE_ARRAY;

		case GL_SAMPLER_1D_SHADOW:							return TYPE_SAMPLER_1D_SHADOW;
		case GL_SAMPLER_2D_SHADOW:							return TYPE_SAMPLER_2D_SHADOW;
		case GL_SAMPLER_CUBE_SHADOW:						return TYPE_SAMPLER_CUBE_SHADOW;
		case GL_SAMPLER_1D_ARRAY_SHADOW:					return TYPE_SAMPLER_1D_ARRAY_SHADOW;
		case GL_SAMPLER_2D_ARRAY_SHADOW:					return TYPE_SAMPLER_2D_ARRAY_SHADOW;
		case GL_SAMPLER_CUBE_MAP_ARRAY_SHADOW:				return TYPE_SAMPLER_CUBE_ARRAY_SHADOW;

		case GL_INT_SAMPLER_1D:								return TYPE_INT_SAMPLER_1D;
		case GL_INT_SAMPLER_2D:								return TYPE_INT_SAMPLER_2D;
		case GL_INT_SAMPLER_CUBE:							return TYPE_INT_SAMPLER_CUBE;
		case GL_INT_SAMPLER_1D_ARRAY:						return TYPE_INT_SAMPLER_1D_ARRAY;
		case GL_INT_SAMPLER_2D_ARRAY:						return TYPE_INT_SAMPLER_2D_ARRAY;
		case GL_INT_SAMPLER_3D:								return TYPE_INT_SAMPLER_3D;
		case GL_INT_SAMPLER_CUBE_MAP_ARRAY:					return TYPE_INT_SAMPLER_CUBE_ARRAY;

		case GL_UNSIGNED_INT_SAMPLER_1D:					return TYPE_UINT_SAMPLER_1D;
		case GL_UNSIGNED_INT_SAMPLER_2D:					return TYPE_UINT_SAMPLER_2D;
		case GL_UNSIGNED_INT_SAMPLER_CUBE:					return TYPE_UINT_SAMPLER_CUBE;
		case GL_UNSIGNED_INT_SAMPLER_1D_ARRAY:				return TYPE_UINT_SAMPLER_1D_ARRAY;
		case GL_UNSIGNED_INT_SAMPLER_2D_ARRAY:				return TYPE_UINT_SAMPLER_2D_ARRAY;
		case GL_UNSIGNED_INT_SAMPLER_3D:					return TYPE_UINT_SAMPLER_3D;
		case GL_UNSIGNED_INT_SAMPLER_CUBE_MAP_ARRAY:		return TYPE_UINT_SAMPLER_CUBE_ARRAY;

		case GL_SAMPLER_2D_MULTISAMPLE:						return TYPE_SAMPLER_2D_MULTISAMPLE;
		case GL_INT_SAMPLER_2D_MULTISAMPLE:					return TYPE_INT_SAMPLER_2D_MULTISAMPLE;
		case GL_UNSIGNED_INT_SAMPLER_2D_MULTISAMPLE:		return TYPE_UINT_SAMPLER_2D_MULTISAMPLE;

		case GL_IMAGE_2D:									return TYPE_IMAGE_2D;
		case GL_IMAGE_CUBE:									return TYPE_IMAGE_CUBE;
		case GL_IMAGE_2D_ARRAY:								return TYPE_IMAGE_2D_ARRAY;
		case GL_IMAGE_3D:									return TYPE_IMAGE_3D;
		case GL_INT_IMAGE_2D:								return TYPE_INT_IMAGE_2D;
		case GL_INT_IMAGE_CUBE:								return TYPE_INT_IMAGE_CUBE;
		case GL_INT_IMAGE_2D_ARRAY:							return TYPE_INT_IMAGE_2D_ARRAY;
		case GL_INT_IMAGE_3D:								return TYPE_INT_IMAGE_3D;
		case GL_UNSIGNED_INT_IMAGE_2D:						return TYPE_UINT_IMAGE_2D;
		case GL_UNSIGNED_INT_IMAGE_CUBE:					return TYPE_UINT_IMAGE_CUBE;
		case GL_UNSIGNED_INT_IMAGE_2D_ARRAY:				return TYPE_UINT_IMAGE_2D_ARRAY;
		case GL_UNSIGNED_INT_IMAGE_3D:						return TYPE_UINT_IMAGE_3D;

		case GL_UNSIGNED_INT_ATOMIC_COUNTER:				return TYPE_UINT_ATOMIC_COUNTER;

		case GL_SAMPLER_BUFFER:								return TYPE_SAMPLER_BUFFER;
		case GL_INT_SAMPLER_BUFFER:							return TYPE_INT_SAMPLER_BUFFER;
		case GL_UNSIGNED_INT_SAMPLER_BUFFER:				return TYPE_UINT_SAMPLER_BUFFER;

		case GL_SAMPLER_2D_MULTISAMPLE_ARRAY:				return TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY;
		case GL_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:			return TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY;
		case GL_UNSIGNED_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:	return TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY;

		case GL_IMAGE_BUFFER:								return TYPE_IMAGE_BUFFER;
		case GL_INT_IMAGE_BUFFER:							return TYPE_INT_IMAGE_BUFFER;
		case GL_UNSIGNED_INT_IMAGE_BUFFER:					return TYPE_UINT_IMAGE_BUFFER;

		default:
			return TYPE_LAST;
	}
}